

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

State __thiscall QSpinBoxValidator::validate(QSpinBoxValidator *this,QString *input,int *pos)

{
  QAbstractSpinBoxPrivate *pQVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  State SVar5;
  char16_t *pcVar6;
  QStringView QVar7;
  QStringView QVar8;
  
  pQVar1 = this->dptr;
  lVar2 = (pQVar1->specialValueText).d.size;
  if ((lVar2 != 0) && (lVar3 = (input->d).size, lVar3 == lVar2)) {
    QVar7.m_data = (input->d).ptr;
    QVar7.m_size = lVar3;
    QVar8.m_data = (pQVar1->specialValueText).d.ptr;
    QVar8.m_size = lVar2;
    cVar4 = QtPrivate::equalStrings(QVar7,QVar8);
    if (cVar4 != '\0') {
      return Acceptable;
    }
  }
  if ((pQVar1->prefix).d.size != 0) {
    cVar4 = QString::startsWith((QString *)input,(int)pQVar1 + 600);
    if (cVar4 == '\0') {
      pcVar6 = (this->dptr->prefix).d.ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QString::_empty;
      }
      QString::insert((longlong)input,(QChar *)0x0,(longlong)pcVar6);
      *pos = *pos + (int)(this->dptr->prefix).d.size;
    }
  }
  if ((this->dptr->suffix).d.size != 0) {
    cVar4 = QString::endsWith((QString *)input,(int)this->dptr + 0x270);
    if (cVar4 == '\0') {
      QString::append((QString *)input);
    }
  }
  SVar5 = (**(code **)(*(long *)&this->qptr->super_QWidget + 0x1a0))(this->qptr,input,pos);
  return SVar5;
}

Assistant:

QValidator::State QSpinBoxValidator::validate(QString &input, int &pos) const
{
    if (dptr->specialValueText.size() > 0 && input == dptr->specialValueText)
        return QValidator::Acceptable;

    if (!dptr->prefix.isEmpty() && !input.startsWith(dptr->prefix)) {
        input.prepend(dptr->prefix);
        pos += dptr->prefix.size();
    }

    if (!dptr->suffix.isEmpty() && !input.endsWith(dptr->suffix))
        input.append(dptr->suffix);

    return qptr->validate(input, pos);
}